

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O1

boolean jt_read_integer(char **strptr,JDIMENSION *result)

{
  char *pcVar1;
  ushort **ppuVar2;
  char *pcVar3;
  JDIMENSION JVar4;
  long lVar5;
  
  pcVar1 = *strptr;
  ppuVar2 = __ctype_b_loc();
  lVar5 = (long)*pcVar1;
  JVar4 = 0;
  pcVar3 = pcVar1;
  if ((*(byte *)((long)*ppuVar2 + lVar5 * 2 + 1) & 8) != 0) {
    JVar4 = 0;
    do {
      JVar4 = ((int)(char)lVar5 + JVar4 * 10) - 0x30;
      lVar5 = (long)pcVar3[1];
      pcVar3 = pcVar3 + 1;
    } while ((*(byte *)((long)*ppuVar2 + lVar5 * 2 + 1) & 8) != 0);
  }
  *result = JVar4;
  if (pcVar3 != pcVar1) {
    *strptr = pcVar3;
  }
  return (uint)(pcVar3 != pcVar1);
}

Assistant:

LOCAL(boolean)
jt_read_integer(const char **strptr, JDIMENSION *result)
{
  const char *ptr = *strptr;
  JDIMENSION val = 0;

  for (; isdigit(*ptr); ptr++) {
    val = val * 10 + (JDIMENSION)(*ptr - '0');
  }
  *result = val;
  if (ptr == *strptr)
    return FALSE;               /* oops, no digits */
  *strptr = ptr;
  return TRUE;
}